

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMakeLabel(Vdbe *v)

{
  uint uVar1;
  void *pvVar2;
  
  uVar1 = (uint)v->nFkConstraint;
  *(uint *)&v->nFkConstraint = uVar1 + 1;
  if ((uVar1 & uVar1 - 1) == 0) {
    pvVar2 = sqlite3DbReallocOrFree(v->db,(void *)v->nStmtDefCons,(long)(int)uVar1 * 8 + 4);
    v->nStmtDefCons = (i64)pvVar2;
  }
  else {
    pvVar2 = (void *)v->nStmtDefCons;
  }
  if (pvVar2 != (void *)0x0) {
    *(undefined4 *)((long)pvVar2 + (long)(int)uVar1 * 4) = 0xffffffff;
  }
  return ~uVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMakeLabel(Vdbe *v){
  Parse *p = v->pParse;
  int i = p->nLabel++;
  assert( v->magic==VDBE_MAGIC_INIT );
  if( (i & (i-1))==0 ){
    p->aLabel = sqlite3DbReallocOrFree(p->db, p->aLabel, 
                                       (i*2+1)*sizeof(p->aLabel[0]));
  }
  if( p->aLabel ){
    p->aLabel[i] = -1;
  }
  return ADDR(i);
}